

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

FileDescriptorProto * __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::ParseFile
          (FileDescriptorProto *__return_storage_ptr__,ValidationErrorTest *this,
          string_view file_name,string_view file_text)

{
  string_view v;
  string_view value;
  bool bVar1;
  const_pointer data;
  size_type sVar2;
  char (*v1) [1];
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  Arena *arena;
  LogMessage local_258;
  Voidify local_241;
  Nullable<const_char_*> local_240;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t sStack_230;
  byte local_221;
  LogMessage local_220;
  Voidify local_20a;
  undefined1 local_209;
  undefined1 local_208 [8];
  Parser parser;
  Tokenizer tokenizer;
  undefined1 local_b0 [8];
  SimpleErrorCollector error_collector;
  ArrayInputStream input_stream;
  ValidationErrorTest *this_local;
  string_view file_text_local;
  string_view file_name_local;
  FileDescriptorProto *proto;
  
  file_text_local._M_len = (size_t)file_text._M_str;
  this_local = (ValidationErrorTest *)file_text._M_len;
  file_text_local._M_str = (char *)file_name._M_len;
  data = std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  protobuf::io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)((long)&error_collector.last_error_.field_2 + 8),data,(int)sVar2,-1
            );
  SimpleErrorCollector::SimpleErrorCollector((SimpleErrorCollector *)local_b0);
  protobuf::io::Tokenizer::Tokenizer
            ((Tokenizer *)
             &parser.upcoming_detached_comments_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ZeroCopyInputStream *)((long)&error_collector.last_error_.field_2 + 8),
             (ErrorCollector *)local_b0);
  compiler::Parser::Parser((Parser *)local_208);
  compiler::Parser::RecordErrorsTo((Parser *)local_208,(ErrorCollector *)local_b0);
  local_209 = 0;
  FileDescriptorProto::FileDescriptorProto(__return_storage_ptr__);
  local_221 = 0;
  bVar1 = compiler::Parser::Parse
                    ((Parser *)local_208,
                     (Tokenizer *)
                     &parser.upcoming_detached_comments_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,__return_storage_ptr__);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x11d8,"parser.Parse(&tokenizer, &proto)");
    local_221 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_220);
    psVar3 = SimpleErrorCollector::last_error_abi_cxx11_((SimpleErrorCollector *)local_b0);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,psVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [2])0x1e65757);
    absl_log_internal_check_op_result = (Nullable<const_char_*>)this_local;
    sStack_230 = file_text_local._M_len;
    v._M_str = (char *)file_text_local._M_len;
    v._M_len = (size_t)this_local;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,v);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_20a,pLVar4);
  }
  if ((local_221 & 1) == 0) {
    v1 = ::const((char (*) [1])(anon_var_dwarf_37cdd0 + 5));
    psVar3 = SimpleErrorCollector::last_error_abi_cxx11_((SimpleErrorCollector *)local_b0);
    v2 = absl::lts_20250127::log_internal::GetReferenceableValue<std::__cxx11::string>(psVar3);
    local_240 = absl::lts_20250127::log_internal::Check_EQImpl<char[1],std::__cxx11::string>
                          (v1,v2,"\"\" == error_collector.last_error()");
    if (local_240 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_240);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_258,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x11db,failure_msg);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_258);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_241,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_258);
    }
    puVar5 = internal::HasBits<1>::operator[]
                       (&(__return_storage_ptr__->field_0)._impl_._has_bits_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    value._M_str = file_name._M_str;
    value._M_len = (size_t)file_text_local._M_str;
    arena = protobuf::MessageLite::GetArena((MessageLite *)__return_storage_ptr__);
    internal::ArenaStringPtr::Set(&(__return_storage_ptr__->field_0)._impl_.name_,value,arena);
    local_209 = 1;
    compiler::Parser::~Parser((Parser *)local_208);
    protobuf::io::Tokenizer::~Tokenizer
              ((Tokenizer *)
               &parser.upcoming_detached_comments_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SimpleErrorCollector::~SimpleErrorCollector((SimpleErrorCollector *)local_b0);
    protobuf::io::ArrayInputStream::~ArrayInputStream
              ((ArrayInputStream *)((long)&error_collector.last_error_.field_2 + 8));
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_220)
  ;
}

Assistant:

FileDescriptorProto ParseFile(absl::string_view file_name,
                                absl::string_view file_text) {
    io::ArrayInputStream input_stream(file_text.data(), file_text.size());
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    compiler::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ABSL_CHECK(parser.Parse(&tokenizer, &proto))
        << error_collector.last_error() << "\n"
        << file_text;
    ABSL_CHECK_EQ("", error_collector.last_error());
    proto.set_name(file_name);
    return proto;
  }